

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O0

event_process_result __thiscall
afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>::
process_event_impl<vending::events::end_maintenance>
          (state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
           *this,end_maintenance *event,process_type<actions::event_process_result::process> *sel)

{
  event_process_result eVar1;
  false_type local_91;
  event_set local_90;
  event_set local_60;
  event_process_result local_2c;
  process_type<actions::event_process_result::process> *ppStack_28;
  event_process_result res;
  process_type<actions::event_process_result::process> *sel_local;
  end_maintenance *event_local;
  state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
  *this_local;
  
  ppStack_28 = sel;
  sel_local = (process_type<actions::event_process_result::process> *)event;
  event_local = (end_maintenance *)this;
  detail::null_observer::
  start_process_event<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,vending::events::end_maintenance>
            ((null_observer *)this,this,event);
  local_2c = detail::
             state_machine_base_impl<vending::vending_def,afsm::none,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>
             ::
             process_event_impl<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,vending::events::end_maintenance>
                       ((state_machine_base_impl<vending::vending_def,afsm::none,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>
                         *)this,this,(end_maintenance *)sel_local,ppStack_28);
  switch(local_2c) {
  case refuse:
    detail::null_observer::
    reject_event<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,vending::events::end_maintenance>
              ((null_observer *)this,this,(end_maintenance *)sel_local);
    eVar1 = reject_event_impl<vending::events::end_maintenance>
                      (this,(end_maintenance *)sel_local,&local_91);
    return eVar1;
  case defer:
    defer_event<vending::events::end_maintenance>(this,(end_maintenance *)sel_local);
    break;
  case process_in_state:
    detail::null_observer::
    processed_in_state<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,vending::events::end_maintenance>
              ((null_observer *)this,this,(end_maintenance *)sel_local);
    break;
  case process:
    detail::
    state_machine_base_impl<vending::vending_def,_afsm::none,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
    ::current_handled_events
              (&local_60,
               (state_machine_base_impl<vending::vending_def,_afsm::none,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                *)this);
    std::
    set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
    ::operator=(&this->handled_,&local_60);
    std::
    set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
    ::~set(&local_60);
    detail::
    state_machine_base_impl<vending::vending_def,_afsm::none,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
    ::current_deferrable_events
              (&local_90,
               (state_machine_base_impl<vending::vending_def,_afsm::none,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                *)this);
    std::
    set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
    ::operator=(&this->deferred_,&local_90);
    std::
    set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
    ::~set(&local_90);
    process_deferred_queue(this);
  }
  return local_2c;
}

Assistant:

actions::event_process_result
    process_event_impl(Event&& event,
        detail::process_type<actions::event_process_result::process> const& sel)
    {
        using actions::event_process_result;
        observer_wrapper::start_process_event(*this, ::std::forward<Event>(event));
        auto res = base_machine_type::process_event_impl(*this, ::std::forward<Event>(event), sel );
        switch (res) {
            case event_process_result::process:
                // Changed state. Process deferred events
                handled_    = base_machine_type::current_handled_events();
                deferred_   = base_machine_type::current_deferrable_events();
                process_deferred_queue();
                break;
            case event_process_result::process_in_state:
                observer_wrapper::processed_in_state(*this, ::std::forward<Event>(event));
                break;
            case event_process_result::defer:
                // Add event to deferred queue
                defer_event(::std::forward<Event>(event));
                break;
            case event_process_result::refuse:
                // The event cannot be processed in current state
                observer_wrapper::reject_event(*this, ::std::forward<Event>(event));
                return reject_event_impl(::std::forward<Event>(event),
                        ::std::integral_constant<bool,
                        actions::detail::handles_reject<T, Event>::value>{});
            default:
                break;
        }
        return res;
    }